

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_write_point_2d(mg_session *session,mg_point_2d *point)

{
  int iVar1;
  char local_1a [2];
  
  local_1a[0] = -0x4d;
  iVar1 = mg_session_write_raw(session,local_1a,1);
  if (iVar1 == 0) {
    local_1a[1] = 0x58;
    iVar1 = mg_session_write_raw(session,local_1a + 1,1);
    if (((iVar1 == 0) && (iVar1 = mg_session_write_integer(session,point->srid), iVar1 == 0)) &&
       (iVar1 = mg_session_write_float(session,point->x), iVar1 == 0)) {
      iVar1 = mg_session_write_float(session,point->y);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_write_point_2d(mg_session *session, const mg_point_2d *point) {
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, (uint8_t)(MG_MARKER_TINY_STRUCT3)));
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, MG_SIGNATURE_POINT_2D));
  MG_RETURN_IF_FAILED(mg_session_write_integer(session, point->srid));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->x));
  MG_RETURN_IF_FAILED(mg_session_write_float(session, point->y));
  return 0;
}